

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_do(Curl_easy *data,_Bool *done)

{
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  *done = false;
  data_local._4_4_ = pop3_parse_url_path(data);
  if ((data_local._4_4_ == CURLE_OK) &&
     (data_local._4_4_ = pop3_parse_custom_request(data), data_local._4_4_ == CURLE_OK)) {
    data_local._4_4_ = pop3_regular_transfer(data,done);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = pop3_parse_url_path(data);
  if(result)
    return result;

  /* Parse the custom request */
  result = pop3_parse_custom_request(data);
  if(result)
    return result;

  result = pop3_regular_transfer(data, done);

  return result;
}